

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

char16 * __thiscall
Js::FunctionProxy::GetDebugNumberSet(FunctionProxy *this,wchar (*bufferToWriteTo) [42])

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  LocalFunctionId LVar4;
  uint uVar5;
  int iVar6;
  undefined4 *puVar7;
  int len;
  wchar (*bufferToWriteTo_local) [42];
  FunctionProxy *this_local;
  
  uVar3 = GetSourceContextId(this);
  LVar4 = GetLocalFunctionId(this);
  uVar5 = GetFunctionNumber(this);
  iVar6 = swprintf_s((char16_t_conflict *)bufferToWriteTo,0x2a,
                     (char16_t_conflict *)L" (#%d.%u), #%u",(ulong)uVar3,(ulong)LVar4,(ulong)uVar5);
  if (iVar6 < 9) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xa1,"(len > 8)","len > 8");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  return *bufferToWriteTo;
}

Assistant:

char16* FunctionProxy::GetDebugNumberSet(wchar(&bufferToWriteTo)[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE]) const
    {
        // (#%u.%u), #%u --> (source file Id . function Id) , function Number
        int len = swprintf_s(bufferToWriteTo, MAX_FUNCTION_BODY_DEBUG_STRING_SIZE, _u(" (#%d.%u), #%u"),
            (int)this->GetSourceContextId(), this->GetLocalFunctionId(), this->GetFunctionNumber());
        Assert(len > 8);
        return bufferToWriteTo;
    }